

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int renumberCursorsCb(Walker *pWalker,Expr *pExpr)

{
  int iVar1;
  
  if ((pExpr->op == 0xb3) || (pExpr->op == 0xa7)) {
    if ((pExpr->iTable < ((pWalker->u).pSrcList)->nSrc) &&
       (iVar1 = *(int *)((long)((pWalker->u).pSrcList)->a + (long)pExpr->iTable * 4 + -4), 0 < iVar1
       )) {
      pExpr->iTable = iVar1;
    }
  }
  if ((pExpr->flags & 1) != 0) {
    if (((pExpr->w).iJoin < ((pWalker->u).pSrcList)->nSrc) &&
       (iVar1 = *(int *)((long)((pWalker->u).pSrcList)->a + (long)(pExpr->w).iJoin * 4 + -4),
       0 < iVar1)) {
      (pExpr->w).iJoin = iVar1;
    }
  }
  return 0;
}

Assistant:

static int renumberCursorsCb(Walker *pWalker, Expr *pExpr){
  int op = pExpr->op;
  if( op==TK_COLUMN || op==TK_IF_NULL_ROW ){
    renumberCursorDoMapping(pWalker, &pExpr->iTable);
  }
  if( ExprHasProperty(pExpr, EP_OuterON) ){
    renumberCursorDoMapping(pWalker, &pExpr->w.iJoin);
  }
  return WRC_Continue;
}